

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

_Bool generateSeeds(tree_t *tree,uint nSeeds,uint8_t *rootSeed,uint8_t *salt,size_t repIndex,
                   picnic_instance_t *params)

{
  _Bool _Var1;
  tree_t *in_RCX;
  void *in_RDX;
  undefined8 *in_RDI;
  tree_t *in_R8;
  long in_R9;
  picnic_instance_t *in_stack_00000108;
  uint in_stack_00000114;
  uint8_t *in_stack_00000118;
  tree_t *in_stack_00000120;
  
  _Var1 = createTree(in_RCX,(uint)((ulong)in_R8 >> 0x20),(uint)in_R8);
  if (_Var1) {
    memcpy((void *)*in_RDI,in_RDX,(ulong)*(byte *)(in_R9 + 7));
    markNode(in_R8,(uint)((ulong)in_R9 >> 0x20));
    expandSeeds(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000108);
  }
  return _Var1;
}

Assistant:

bool generateSeeds(tree_t* tree, unsigned int nSeeds, uint8_t* rootSeed, uint8_t* salt,
                   size_t repIndex, const picnic_instance_t* params) {
  if (!createTree(tree, nSeeds, params->seed_size)) {
    return false;
  }

  memcpy(tree->nodes, rootSeed, params->seed_size);
  markNode(tree, 0);
  expandSeeds(tree, salt, repIndex, params);

  return true;
}